

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseEmpty(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Node *node_00;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  if ((doc->lexer->isvoyager != no) && (node_00 = prvTidyGetToken(doc,mode), node_00 != (Node *)0x0)
     ) {
    if ((node_00->type == EndTag) && (node_00->tag == element->tag)) {
      prvTidyFreeNode(doc,node_00);
    }
    else {
      prvTidyUngetToken(doc);
    }
  }
  return;
}

Assistant:

void TY_(ParseEmpty)(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    if ( lexer->isvoyager )
    {
        Node *node = TY_(GetToken)( doc, mode);
        if ( node )
        {
            if ( !(node->type == EndTag && node->tag == element->tag) )
            {
                /* TY_(ReportError)(doc, element, node, ELEMENT_NOT_EMPTY); */
                TY_(UngetToken)( doc );
            }
            else
            {
                TY_(FreeNode)( doc, node );
            }
        }
    }
}